

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

int __thiscall
event_track::ingest_event_stream::load_from_file
          (ingest_event_stream *this,istream *infile,bool init_only)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  pointer puVar11;
  int iVar12;
  uint32_t uVar13;
  ssize_t sVar14;
  ulong uVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  size_t in_RCX;
  ulong uVar18;
  undefined7 in_register_00000011;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  uint64_t uVar19;
  uint uVar20;
  string *psVar21;
  pointer pbVar22;
  long lVar23;
  ingest_event_stream *piVar24;
  bool bVar25;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sample_data;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  exception e;
  DASHEventMessageBoxv1 e_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_770;
  ulong local_758;
  key_type *local_750;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_748;
  uint64_t local_740;
  ingest_event_stream *local_738;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
  *local_730;
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> local_728;
  DASHEventMessageBoxv1 local_710;
  undefined ***local_638;
  undefined1 *local_630;
  string *local_628;
  string *local_620;
  long local_618;
  ulong local_610;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_608;
  uint8_t *local_600;
  string *local_5f8;
  uint32_t *local_5f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_5e8;
  uint8_t *local_5e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_5d8;
  uint8_t *local_5d0;
  string *local_5c8;
  uint32_t *local_5c0;
  string *local_5b8;
  uint32_t *local_5b0;
  undefined8 *local_5a8;
  pointer local_5a0;
  undefined8 *local_598;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_590;
  uint8_t *local_588;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_580;
  uint8_t *local_578;
  uint32_t *local_570;
  string *local_568;
  uint32_t *local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_548;
  string *local_540;
  string *local_538;
  uchar *local_530 [2];
  uchar local_520 [16];
  uchar *local_510 [2];
  uchar local_500 [16];
  undefined1 local_4f0 [264];
  _Alloc_hider local_3e8;
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  uint8_t local_3c8 [8];
  uint8_t auStack_3c0 [8];
  undefined1 local_3b8 [24];
  undefined2 uStack_3a0;
  undefined **local_398;
  undefined8 local_390;
  uint64_t uStack_388;
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  uint8_t local_360 [8];
  uint8_t auStack_358 [8];
  undefined1 local_350 [24];
  undefined2 uStack_338;
  undefined8 local_330 [3];
  mfhd local_318;
  tfhd local_2a8;
  tfdt local_218;
  trun local_1a0;
  DASHEventMessageBoxv1 local_108;
  
  __buf = (void *)CONCAT71(in_register_00000011,init_only);
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    local_728.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_728.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_728.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_738 = this;
    do {
      if (*(int *)(infile + *(long *)(*(long *)infile + -0x18) + 0x20) != 0) break;
      local_4f0._0_8_ = &PTR_size_00128380;
      local_4f0._8_4_ = 0;
      local_4f0._16_8_ = 0;
      local_4f0._24_8_ = local_4f0 + 0x28;
      local_4f0._32_8_ = 0;
      local_4f0[0x28] = '\0';
      local_4f0._88_2_ = 0;
      local_4f0._90_8_ = 0;
      local_4f0._72_8_ = (pointer)0x0;
      local_4f0._80_2_ = 0;
      local_4f0._82_6_ = 0;
      sVar14 = fmp4_stream::box::read((box *)local_4f0,(int)infile,__buf,in_RCX);
      if ((char)sVar14 == '\0') {
        bVar25 = false;
        __buf = extraout_RDX;
      }
      else {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                  (&local_728,(value_type *)local_4f0);
        iVar12 = std::__cxx11::string::compare(local_4f0 + 0x18);
        bVar25 = iVar12 != 0;
        __buf = extraout_RDX_00;
      }
      local_4f0._0_8_ = &PTR_size_00128380;
      if ((pointer)local_4f0._72_8_ != (pointer)0x0) {
        operator_delete((void *)local_4f0._72_8_);
        __buf = extraout_RDX_01;
      }
      if ((undefined1 *)local_4f0._24_8_ != local_4f0 + 0x28) {
        operator_delete((void *)local_4f0._24_8_);
        __buf = extraout_RDX_02;
      }
    } while (bVar25);
    if (local_728.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_728.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      psVar21 = (string *)&(local_738->super_ingest_stream).init_fragment_.moov_box_.box_type_;
      local_588 = (local_738->super_ingest_stream).init_fragment_.moov_box_.extended_type_;
      local_590 = &(local_738->super_ingest_stream).init_fragment_.moov_box_.box_data_;
      local_598 = (undefined8 *)(local_4f0 + 0xb0);
      local_750 = &local_710.scheme_id_uri_;
      local_620 = &local_710.value_;
      paVar2 = &local_710.value_.field_2;
      local_748 = &local_710.message_data_;
      local_538 = &local_108.scheme_id_uri_;
      local_540 = &local_108.value_;
      local_548 = &local_108.message_data_;
      local_550 = &local_108.value_.field_2;
      local_5a0 = local_4f0 + 0x90;
      paVar3 = &local_710.scheme_id_uri_.field_2;
      local_558 = &local_108.scheme_id_uri_.field_2;
      local_5a8 = local_330;
      local_5b0 = &(local_738->super_ingest_stream).mfra_box_.size_;
      local_630 = local_4f0 + 0xf0;
      local_5c0 = &(local_738->super_ingest_stream).sidx_box_.size_;
      local_638 = &local_398;
      local_5f0 = &(local_738->super_ingest_stream).meta_box_.size_;
      local_560 = &(local_738->super_ingest_stream).init_fragment_.ftyp_box_.size_;
      local_568 = (string *)&(local_738->super_ingest_stream).init_fragment_.ftyp_box_.box_type_;
      local_578 = (local_738->super_ingest_stream).init_fragment_.ftyp_box_.extended_type_;
      local_580 = &(local_738->super_ingest_stream).init_fragment_.ftyp_box_.box_data_;
      local_570 = &(local_738->super_ingest_stream).init_fragment_.moov_box_.size_;
      local_730 = &local_738->events_list_;
      local_5b8 = (string *)&(local_738->super_ingest_stream).mfra_box_.box_type_;
      local_5d0 = (local_738->super_ingest_stream).mfra_box_.extended_type_;
      local_5d8 = &(local_738->super_ingest_stream).mfra_box_.box_data_;
      local_5c8 = (string *)&(local_738->super_ingest_stream).sidx_box_.box_type_;
      local_5e0 = (local_738->super_ingest_stream).sidx_box_.extended_type_;
      local_5e8 = &(local_738->super_ingest_stream).sidx_box_.box_data_;
      local_5f8 = (string *)&(local_738->super_ingest_stream).meta_box_.box_type_;
      local_600 = (local_738->super_ingest_stream).meta_box_.extended_type_;
      local_608 = &(local_738->super_ingest_stream).meta_box_.box_data_;
      pbVar22 = local_728.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
                _M_impl.super__Vector_impl_data._M_start;
      piVar24 = local_738;
      local_628 = psVar21;
      do {
        psVar1 = &pbVar22->box_type_;
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar10 = *(undefined4 *)&pbVar22->field_0xc;
          uVar19 = pbVar22->large_size_;
          local_560[0] = pbVar22->size_;
          local_560[1] = uVar10;
          *(uint64_t *)(local_560 + 2) = uVar19;
          std::__cxx11::string::_M_assign(local_568);
          uVar9 = *(undefined8 *)(pbVar22->extended_type_ + 8);
          *(undefined8 *)local_578 = *(undefined8 *)pbVar22->extended_type_;
          *(undefined8 *)(local_578 + 8) = uVar9;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_580,&pbVar22->box_data_);
          bVar25 = pbVar22->has_uuid_;
          (piVar24->super_ingest_stream).init_fragment_.ftyp_box_.is_large_ = pbVar22->is_large_;
          (piVar24->super_ingest_stream).init_fragment_.ftyp_box_.has_uuid_ = bVar25;
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar10 = *(undefined4 *)&pbVar22->field_0xc;
          uVar19 = pbVar22->large_size_;
          local_570[0] = pbVar22->size_;
          local_570[1] = uVar10;
          *(uint64_t *)(local_570 + 2) = uVar19;
          std::__cxx11::string::_M_assign(psVar21);
          uVar9 = *(undefined8 *)(pbVar22->extended_type_ + 8);
          *(undefined8 *)local_588 = *(undefined8 *)pbVar22->extended_type_;
          *(undefined8 *)(local_588 + 8) = uVar9;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_590,&pbVar22->box_data_);
          bVar25 = pbVar22->has_uuid_;
          (piVar24->super_ingest_stream).init_fragment_.moov_box_.is_large_ = pbVar22->is_large_;
          (piVar24->super_ingest_stream).init_fragment_.moov_box_.has_uuid_ = bVar25;
          if (init_only) {
            std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_728);
            return 0;
          }
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          local_4f0._0_8_ = &PTR_size_00128380;
          local_4f0._8_4_ = 0;
          local_4f0._16_8_ = 0;
          local_4f0._24_8_ = local_4f0 + 0x28;
          local_4f0._32_8_ = 0;
          local_4f0[0x28] = '\0';
          local_4f0._88_2_ = 0;
          local_4f0._90_8_ = 0;
          local_4f0._72_8_ = (pointer)0x0;
          local_4f0._80_2_ = 0;
          local_4f0._82_6_ = 0;
          local_4f0._104_8_ = &PTR_size_00128380;
          local_4f0._112_4_ = 0;
          local_4f0._120_8_ = 0;
          local_4f0._128_8_ = local_5a0;
          local_4f0._136_8_ = 0;
          local_4f0[0x90] = '\0';
          *(undefined8 *)((long)local_598 + 10) = 0;
          *(undefined8 *)((long)local_598 + 0x12) = 0;
          *local_598 = 0;
          local_598[1] = 0;
          local_4f0[0xe0] = 0;
          local_4f0._225_8_ = 0;
          local_4f0._208_8_ = (pointer)0x0;
          local_4f0[0xd8] = 0;
          local_4f0._217_7_ = 0;
          local_4f0._240_8_ = &PTR_size_00128380;
          local_4f0._248_8_ = (ulong)(uint)local_4f0._252_4_ << 0x20;
          local_4f0._256_8_ = 0;
          local_3e8._M_p = (pointer)&local_3d8;
          local_3e0 = 0;
          local_3d8._M_local_buf[0] = '\0';
          local_3b8._16_2_ = 0;
          stack0xfffffffffffffc5a = 0;
          local_3b8._0_8_ = (pointer)0x0;
          local_3b8._8_2_ = 0;
          local_3b8._10_6_ = 0;
          local_398 = &PTR_size_00128380;
          local_390 = (ulong)local_390._4_4_ << 0x20;
          uStack_388 = 0;
          local_380._M_p = (pointer)&local_370;
          local_378 = 0;
          local_370._M_local_buf[0] = '\0';
          local_350._16_2_ = 0;
          stack0xfffffffffffffcc2 = 0;
          local_350._0_8_ = (pointer)0x0;
          local_350._8_2_ = 0;
          local_350._10_6_ = 0;
          *(undefined4 *)(local_5a8 + 2) = 0;
          *local_5a8 = 0;
          local_5a8[1] = 0;
          fmp4_stream::mfhd::mfhd(&local_318);
          fmp4_stream::tfhd::tfhd(&local_2a8);
          fmp4_stream::tfdt::tfdt(&local_218);
          fmp4_stream::trun::trun(&local_1a0);
          local_4f0._248_4_ = pbVar22->size_;
          local_4f0._252_4_ = *(undefined4 *)&pbVar22->field_0xc;
          local_4f0._256_8_ = pbVar22->large_size_;
          std::__cxx11::string::_M_assign((string *)&local_3e8);
          local_3c8 = *(uint8_t (*) [8])pbVar22->extended_type_;
          auStack_3c0 = *(uint8_t (*) [8])(pbVar22->extended_type_ + 8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3b8,
                     &pbVar22->box_data_);
          uVar9 = stack0xfffffffffffffc5a;
          uVar4 = pbVar22->is_large_;
          uVar6 = pbVar22->has_uuid_;
          uStack_3a0._1_1_ = (bool)uVar6;
          uStack_3a0._0_1_ = (bool)uVar4;
          local_3b8._18_6_ = (undefined6)uVar9;
          fmp4_stream::media_fragment::parse_moof((media_fragment *)local_4f0);
          if ((local_2a8.default_base_is_moof_ == true) &&
             (local_1a0.data_offset_ - 8U == local_4f0._248_4_)) {
            iVar12 = std::__cxx11::string::compare((char *)&pbVar22[1].box_type_);
            if (iVar12 == 0) {
              local_390 = *(long *)&pbVar22[1].size_;
              uStack_388 = pbVar22[1].large_size_;
              std::__cxx11::string::_M_assign((string *)&local_380);
              local_360 = *(uint8_t (*) [8])pbVar22[1].extended_type_;
              auStack_358 = *(uint8_t (*) [8])(pbVar22[1].extended_type_ + 8);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_350,
                         &pbVar22[1].box_data_);
              uVar9 = stack0xfffffffffffffcc2;
              uVar5 = pbVar22[1].is_large_;
              uVar7 = pbVar22[1].has_uuid_;
              uStack_338._1_1_ = (bool)uVar7;
              uStack_338._0_1_ = (bool)uVar5;
              local_350._18_6_ = (undefined6)uVar9;
              if (((local_1a0.sample_duration_present_ == true) &&
                  (local_1a0.sample_size_present_ == true)) &&
                 (local_1a0.m_sentry.
                  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_1a0.m_sentry.
                  super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
                uVar18 = 0;
                local_758 = 0;
                uVar19 = local_218.base_media_decode_time_;
                do {
                  lVar23 = uVar18 * 0x20;
                  uVar8 = local_1a0.m_sentry.
                          super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar18].sample_size_;
                  uVar15 = (ulong)uVar8;
                  local_740 = uVar19;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&local_770,uVar15,(allocator_type *)&local_710);
                  puVar11 = local_770.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  local_618 = lVar23;
                  local_610 = uVar18;
                  if (uVar15 != 0) {
                    uVar18 = 0;
                    do {
                      local_770.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar18] =
                           *(pointer)(local_350._0_8_ +
                                     (ulong)(uint)((int)local_758 + 8 + (int)uVar18));
                      uVar18 = uVar18 + 1;
                    } while (uVar15 != uVar18);
                    if (8 < uVar8) {
                      local_510[0] = local_500;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"emib","")
                      ;
                      if (((puVar11[4] != *local_510[0]) || (puVar11[5] != local_510[0][1])) ||
                         ((puVar11[6] != local_510[0][2] ||
                          (bVar25 = true, puVar11[7] != local_510[0][3])))) {
                        bVar25 = false;
                      }
                      if (local_510[0] != local_500) {
                        operator_delete(local_510[0]);
                      }
                      puVar11 = local_770.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      if (bVar25) {
                        uVar18 = (long)local_770.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_770.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                        if (uVar18 != 0) {
                          uVar15 = 0;
                          uVar20 = 0;
                          do {
                            uVar19 = local_740;
                            local_710.super_full_box.super_box.size_ = 0;
                            local_710.super_full_box.super_box.large_size_ = 0;
                            local_710.super_full_box.super_box.box_type_._M_dataplus._M_p =
                                 (pointer)&local_710.super_full_box.super_box.box_type_.field_2;
                            local_710.super_full_box.super_box.box_type_._M_string_length = 0;
                            local_710.super_full_box.super_box.box_type_.field_2._M_local_buf[0] =
                                 '\0';
                            local_710.super_full_box._100_6_ = 0;
                            local_710.super_full_box.magic_conf_._2_2_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._0_3_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._3_5_ = 0;
                            local_710.super_full_box.super_box.is_large_ = false;
                            local_710.super_full_box.super_box.has_uuid_ = false;
                            local_710.super_full_box.super_box._98_1_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_3_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._3_5_ = 0;
                            local_710.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_00128310;
                            local_710.id_ = 0;
                            local_710._108_8_ = 0;
                            local_710._116_8_ = 0;
                            local_710.scheme_id_uri_._M_string_length = 0;
                            local_710.scheme_id_uri_.field_2._M_local_buf[0] = '\0';
                            local_710.value_._M_string_length = 0;
                            local_710.value_.field_2._M_local_buf[0] = '\0';
                            (local_748->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            (local_748->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            (local_748->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_710.scheme_id_uri_._M_dataplus._M_p = (pointer)paVar3;
                            local_710.value_._M_dataplus._M_p = (pointer)paVar2;
                            uVar13 = EventMessageInstanceBox::parse
                                               ((EventMessageInstanceBox *)&local_710,
                                                (char *)(local_770.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar15
                                                  ),(uint)uVar18,local_740);
                            EventMessageInstanceBox::to_emsg_v1
                                      (&local_108,(EventMessageInstanceBox *)&local_710,uVar19);
                            pmVar16 = std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
                                      ::operator[](local_730,local_750);
                            pmVar17 = std::
                                      map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>
                                      ::operator[](pmVar16,&local_710.id_);
                            (pmVar17->super_full_box).super_box.size_ =
                                 local_108.super_full_box.super_box.size_;
                            *(undefined4 *)&(pmVar17->super_full_box).super_box.field_0xc =
                                 local_108.super_full_box.super_box._12_4_;
                            (pmVar17->super_full_box).super_box.large_size_ =
                                 local_108.super_full_box.super_box.large_size_;
                            std::__cxx11::string::_M_assign
                                      ((string *)&(pmVar17->super_full_box).super_box.box_type_);
                            *(undefined8 *)(pmVar17->super_full_box).super_box.extended_type_ =
                                 local_108.super_full_box.super_box.extended_type_._0_8_;
                            *(undefined8 *)((pmVar17->super_full_box).super_box.extended_type_ + 8)
                                 = local_108.super_full_box.super_box.extended_type_._8_8_;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                      (&(pmVar17->super_full_box).super_box.box_data_,
                                       &local_108.super_full_box.super_box.box_data_);
                            (pmVar17->super_full_box).super_box.is_large_ =
                                 local_108.super_full_box.super_box.is_large_;
                            (pmVar17->super_full_box).super_box.has_uuid_ =
                                 local_108.super_full_box.super_box.has_uuid_;
                            *(undefined8 *)&(pmVar17->super_full_box).super_box.field_0x62 =
                                 local_108.super_full_box._98_8_;
                            *(undefined2 *)((long)&(pmVar17->super_full_box).magic_conf_ + 2) =
                                 local_108.super_full_box.magic_conf_._2_2_;
                            *(undefined8 *)&(pmVar17->super_full_box).field_0x6c = local_108._108_8_
                            ;
                            *(undefined8 *)((long)&pmVar17->presentation_time_ + 4) =
                                 local_108._116_8_;
                            pmVar17->id_ = local_108.id_;
                            std::__cxx11::string::_M_assign((string *)&pmVar17->scheme_id_uri_);
                            std::__cxx11::string::_M_assign((string *)&pmVar17->value_);
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                      (&pmVar17->message_data_,local_548);
                            local_108.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_001282c8;
                            if (local_108.message_data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_108.message_data_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_108.value_._M_dataplus._M_p != local_550) {
                              operator_delete(local_108.value_._M_dataplus._M_p);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_108.scheme_id_uri_._M_dataplus._M_p != local_558) {
                              operator_delete(local_108.scheme_id_uri_._M_dataplus._M_p);
                            }
                            local_108.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_00128380;
                            if (local_108.super_full_box.super_box.box_data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_108.super_full_box.super_box.box_data_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_108.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                                &local_108.super_full_box.super_box.box_type_.field_2) {
                              operator_delete(local_108.super_full_box.super_box.box_type_.
                                              _M_dataplus._M_p);
                            }
                            local_710.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_00128310;
                            if (local_710.message_data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_710.message_data_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_710.value_._M_dataplus._M_p != paVar2) {
                              operator_delete(local_710.value_._M_dataplus._M_p);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_710.scheme_id_uri_._M_dataplus._M_p != paVar3) {
                              operator_delete(local_710.scheme_id_uri_._M_dataplus._M_p);
                            }
                            local_710.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_00128380;
                            if (local_710.super_full_box.super_box.box_data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_710.super_full_box.super_box.box_data_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_710.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                                &local_710.super_full_box.super_box.box_type_.field_2) {
                              operator_delete(local_710.super_full_box.super_box.box_type_.
                                              _M_dataplus._M_p);
                            }
                            uVar20 = uVar20 + uVar13;
                            uVar15 = (ulong)uVar20;
                            uVar18 = (long)local_770.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_770.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                          } while (uVar15 < uVar18);
                        }
                      }
                      else {
                        local_530[0] = local_520;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_530,"emsg","");
                        if (((puVar11[4] != *local_530[0]) || (puVar11[5] != local_530[0][1])) ||
                           ((puVar11[6] != local_530[0][2] ||
                            (bVar25 = true, puVar11[7] != local_530[0][3])))) {
                          bVar25 = false;
                        }
                        if (local_530[0] != local_520) {
                          operator_delete(local_530[0]);
                        }
                        if ((bVar25) &&
                           (uVar18 = (long)local_770.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_770.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start, uVar18 != 0))
                        {
                          uVar15 = 0;
                          uVar20 = 0;
                          do {
                            local_710.super_full_box.super_box.size_ = 0;
                            local_710.super_full_box.super_box.large_size_ = 0;
                            local_710.super_full_box.super_box.box_type_._M_dataplus._M_p =
                                 (pointer)&local_710.super_full_box.super_box.box_type_.field_2;
                            local_710.super_full_box.super_box.box_type_._M_string_length = 0;
                            local_710.super_full_box.super_box.box_type_.field_2._M_local_buf[0] =
                                 '\0';
                            local_710.super_full_box._100_6_ = 0;
                            local_710.super_full_box.magic_conf_._2_2_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._0_3_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._3_5_ = 0;
                            local_710.super_full_box.super_box.is_large_ = false;
                            local_710.super_full_box.super_box.has_uuid_ = false;
                            local_710.super_full_box.super_box._98_1_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_3_ = 0;
                            local_710.super_full_box.super_box.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._3_5_ = 0;
                            local_710.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_001282c8;
                            local_710.scheme_id_uri_._M_string_length = 0;
                            local_710.scheme_id_uri_.field_2._M_local_buf[0] = '\0';
                            local_710.value_._M_string_length = 0;
                            local_710.value_.field_2._M_local_buf[0] = '\0';
                            (local_748->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                            (local_748->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                            (local_748->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                            local_710.scheme_id_uri_._M_dataplus._M_p = (pointer)paVar3;
                            local_710.value_._M_dataplus._M_p = (pointer)paVar2;
                            uVar13 = DASHEventMessageBoxv1::parse
                                               (&local_710,
                                                (char *)(local_770.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar15
                                                  ),(uint)uVar18,local_740);
                            pmVar16 = std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>_>_>_>
                                      ::operator[](local_730,local_750);
                            pmVar17 = std::
                                      map<unsigned_int,_event_track::DASHEventMessageBoxv1,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_event_track::DASHEventMessageBoxv1>_>_>
                                      ::operator[](pmVar16,&local_710.id_);
                            *(ulong *)&(pmVar17->super_full_box).super_box.size_ =
                                 CONCAT44(local_710.super_full_box.super_box._12_4_,
                                          local_710.super_full_box.super_box.size_);
                            (pmVar17->super_full_box).super_box.large_size_ =
                                 local_710.super_full_box.super_box.large_size_;
                            std::__cxx11::string::_M_assign
                                      ((string *)&(pmVar17->super_full_box).super_box.box_type_);
                            *(undefined8 *)(pmVar17->super_full_box).super_box.extended_type_ =
                                 local_710.super_full_box.super_box.extended_type_._0_8_;
                            *(undefined8 *)((pmVar17->super_full_box).super_box.extended_type_ + 8)
                                 = local_710.super_full_box.super_box.extended_type_._8_8_;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                      (&(pmVar17->super_full_box).super_box.box_data_,
                                       &local_710.super_full_box.super_box.box_data_);
                            (pmVar17->super_full_box).super_box.is_large_ =
                                 local_710.super_full_box.super_box.is_large_;
                            (pmVar17->super_full_box).super_box.has_uuid_ =
                                 local_710.super_full_box.super_box.has_uuid_;
                            *(ulong *)&(pmVar17->super_full_box).super_box.field_0x62 =
                                 CONCAT62(local_710.super_full_box._100_6_,
                                          CONCAT11(local_710.super_full_box.super_box._99_1_,
                                                   local_710.super_full_box.super_box._98_1_));
                            *(undefined2 *)((long)&(pmVar17->super_full_box).magic_conf_ + 2) =
                                 local_710.super_full_box.magic_conf_._2_2_;
                            *(undefined8 *)&(pmVar17->super_full_box).field_0x6c = local_710._108_8_
                            ;
                            *(undefined8 *)((long)&pmVar17->presentation_time_ + 4) =
                                 local_710._116_8_;
                            pmVar17->id_ = local_710.id_;
                            std::__cxx11::string::_M_assign((string *)&pmVar17->scheme_id_uri_);
                            std::__cxx11::string::_M_assign((string *)&pmVar17->value_);
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                      (&pmVar17->message_data_,local_748);
                            local_710.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_001282c8;
                            if (local_710.message_data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_710.message_data_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_710.value_._M_dataplus._M_p != paVar2) {
                              operator_delete(local_710.value_._M_dataplus._M_p);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_710.scheme_id_uri_._M_dataplus._M_p != paVar3) {
                              operator_delete(local_710.scheme_id_uri_._M_dataplus._M_p);
                            }
                            local_710.super_full_box.super_box._vptr_box =
                                 (_func_int **)&PTR_size_00128380;
                            if (local_710.super_full_box.super_box.box_data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                              operator_delete(local_710.super_full_box.super_box.box_data_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_710.super_full_box.super_box.box_type_._M_dataplus._M_p !=
                                &local_710.super_full_box.super_box.box_type_.field_2) {
                              operator_delete(local_710.super_full_box.super_box.box_type_.
                                              _M_dataplus._M_p);
                            }
                            uVar20 = uVar20 + uVar13;
                            uVar15 = (ulong)uVar20;
                            uVar18 = (long)local_770.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_770.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                          } while (uVar15 < uVar18);
                        }
                      }
                    }
                  }
                  uVar20 = *(uint *)((long)&(local_1a0.m_sentry.
                                             super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            sample_duration_ + local_618);
                  if (local_770.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_770.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                  local_758 = (ulong)(uVar8 + (int)local_758);
                  uVar19 = local_740 + uVar20;
                  uVar18 = local_610 + 1;
                  psVar21 = local_628;
                  piVar24 = local_738;
                } while (uVar18 < (ulong)((long)local_1a0.m_sentry.
                                                super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_1a0.m_sentry.
                                                super__Vector_base<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following"
                       ,0x68);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
            std::ostream::put(-0x30);
            std::ostream::flush();
          }
          pbVar22 = pbVar22 + 1;
          fmp4_stream::media_fragment::~media_fragment((media_fragment *)local_4f0);
        }
        psVar1 = &pbVar22->box_type_;
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar10 = *(undefined4 *)&pbVar22->field_0xc;
          uVar19 = pbVar22->large_size_;
          local_5b0[0] = pbVar22->size_;
          local_5b0[1] = uVar10;
          *(uint64_t *)(local_5b0 + 2) = uVar19;
          std::__cxx11::string::_M_assign(local_5b8);
          uVar9 = *(undefined8 *)(pbVar22->extended_type_ + 8);
          *(undefined8 *)local_5d0 = *(undefined8 *)pbVar22->extended_type_;
          *(undefined8 *)(local_5d0 + 8) = uVar9;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_5d8,&pbVar22->box_data_);
          bVar25 = pbVar22->has_uuid_;
          (piVar24->super_ingest_stream).mfra_box_.is_large_ = pbVar22->is_large_;
          (piVar24->super_ingest_stream).mfra_box_.has_uuid_ = bVar25;
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar10 = *(undefined4 *)&pbVar22->field_0xc;
          uVar19 = pbVar22->large_size_;
          local_5c0[0] = pbVar22->size_;
          local_5c0[1] = uVar10;
          *(uint64_t *)(local_5c0 + 2) = uVar19;
          std::__cxx11::string::_M_assign(local_5c8);
          uVar9 = *(undefined8 *)(pbVar22->extended_type_ + 8);
          *(undefined8 *)local_5e0 = *(undefined8 *)pbVar22->extended_type_;
          *(undefined8 *)(local_5e0 + 8) = uVar9;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_5e8,&pbVar22->box_data_);
          bVar25 = pbVar22->has_uuid_;
          (piVar24->super_ingest_stream).sidx_box_.is_large_ = pbVar22->is_large_;
          (piVar24->super_ingest_stream).sidx_box_.has_uuid_ = bVar25;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|sidx|",6);
        }
        iVar12 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar12 == 0) {
          uVar10 = *(undefined4 *)&pbVar22->field_0xc;
          uVar19 = pbVar22->large_size_;
          local_5f0[0] = pbVar22->size_;
          local_5f0[1] = uVar10;
          *(uint64_t *)(local_5f0 + 2) = uVar19;
          std::__cxx11::string::_M_assign(local_5f8);
          uVar9 = *(undefined8 *)(pbVar22->extended_type_ + 8);
          *(undefined8 *)local_600 = *(undefined8 *)pbVar22->extended_type_;
          *(undefined8 *)(local_600 + 8) = uVar9;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (local_608,&pbVar22->box_data_);
          bVar25 = pbVar22->has_uuid_;
          (piVar24->super_ingest_stream).meta_box_.is_large_ = pbVar22->is_large_;
          (piVar24->super_ingest_stream).meta_box_.has_uuid_ = bVar25;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|meta|",6);
        }
        pbVar22 = pbVar22 + 1;
      } while (pbVar22 !=
               local_728.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&local_728);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return 0;
}

Assistant:

int event_track::ingest_event_stream::load_from_file(std::istream &infile, bool init_only)
{
	try
	{
		if (infile)
		{
			std::vector<box> ingest_boxes;

			while (infile.good()) // read box by box in a vector
			{
				box b = {};

				if (b.read(infile))
					ingest_boxes.push_back(b);
				else  // break when we have boxes of size zero
					break;

				if (b.box_type_.compare("mfra") == 0)
					break;
			}

			// organize the boxes in init fragments and media fragments 
			for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
			{
				if (it->box_type_.compare("ftyp") == 0)
				{
					//cout << "|ftyp|";
					init_fragment_.ftyp_box_ = *it;
				}
				if (it->box_type_.compare("moov") == 0)
				{
					//cout << "|moov|";
					init_fragment_.moov_box_ = *it;
					if (init_only)
						return 0;
				}

				if (it->box_type_.compare("moof") == 0) // in case of moof box we push both the moof and following mdat
				{
					media_fragment m = {};
					m.moof_box_ = *it;
					m.parse_moof();
					bool mdat_found = false;
					
					it++;

					// only support default base is moof and mdat immediately following (CMAF)
					if (m.tfhd_.default_base_is_moof_ && (m.trun_.data_offset_ - 8) == m.moof_box_.size_) {

						if (it->box_type_.compare("mdat") == 0)
						{
							m.mdat_box_ = *it;
							uint64_t pres_time = m.tfdt_.base_media_decode_time_;
							uint32_t data_offset = 0;

							if (m.trun_.sample_duration_present_ && m.trun_.sample_size_present_)
							{
								for (int i = 0; i < m.trun_.m_sentry.size(); i++)
								{
									uint32_t ss = m.trun_.m_sentry[i].sample_size_;
									std::vector<uint8_t> sample_data(ss);
									
									for (unsigned int j = 0; j < ss; j++)
										sample_data[j] = m.mdat_box_.box_data_[8 + data_offset + j];
				
									//parse_event_sample(sample_data,uint64_t presentation_time, )
									unsigned int bts = 0;
									if (ss > 8)
									{
										if (compare_4cc((char *) &sample_data[4], "emib")) {
											while (bts < sample_data.size()) {
												EventMessageInstanceBox im_box;
												bts += im_box.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												auto e = im_box.to_emsg_v1(pres_time);
												events_list_[im_box.scheme_id_uri_][im_box.id_] = e;
											}
										}
										else if (compare_4cc((char *)&sample_data[4], "emsg"))
										{
											while (bts < sample_data.size()) 
											{
												DASHEventMessageBoxv1 e;
												bts += e.parse((char *)sample_data.data() + bts, (unsigned int)sample_data.size(),pres_time);
												events_list_[e.scheme_id_uri_][e.id_] = e;
											}
										}
									}

									data_offset += ss;
									pres_time += m.trun_.m_sentry[i].sample_duration_;
								}
							}
						}
					}
					else 
					{
						std::cout << "error only CMAF based metadata tracks supported with default_base_is_moof and mdat immediately following" << std::endl;
					}
				}
				if (it->box_type_.compare("mfra") == 0)
				{
					this->mfra_box_ = *it;
				}
				if (it->box_type_.compare("sidx") == 0)
				{
					this->sidx_box_ = *it;
					std::cout << "|sidx|";
				}
				if (it->box_type_.compare("meta") == 0)
				{
					this->meta_box_ = *it;
					std::cout << "|meta|";
				}
			}
		}
		std::cout << std::endl;
		std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;

		return 0;
	}
	catch (std::exception e)
	{
		std::cout << e.what() << std::endl;
		return 0;
	}
}